

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_parameters *
ZSTD_getParams_internal
          (ZSTD_parameters *__return_storage_ptr__,int compressionLevel,
          unsigned_long_long srcSizeHint,size_t dictSize,ZSTD_cParamMode_e mode)

{
  ZSTD_parameters *params;
  undefined1 local_40 [8];
  ZSTD_compressionParameters cParams;
  ZSTD_cParamMode_e mode_local;
  size_t dictSize_local;
  unsigned_long_long srcSizeHint_local;
  int compressionLevel_local;
  
  cParams.targetLength = mode;
  unique0x10000106 = dictSize;
  ZSTD_getCParams_internal
            ((ZSTD_compressionParameters *)local_40,compressionLevel,srcSizeHint,dictSize,mode);
  memset(__return_storage_ptr__,0,0x28);
  (__return_storage_ptr__->cParams).windowLog = local_40._0_4_;
  (__return_storage_ptr__->cParams).chainLog = local_40._4_4_;
  (__return_storage_ptr__->cParams).hashLog = cParams.windowLog;
  (__return_storage_ptr__->cParams).searchLog = cParams.chainLog;
  (__return_storage_ptr__->cParams).minMatch = cParams.hashLog;
  (__return_storage_ptr__->cParams).targetLength = cParams.searchLog;
  (__return_storage_ptr__->cParams).strategy = cParams.minMatch;
  (__return_storage_ptr__->fParams).contentSizeFlag = 1;
  return __return_storage_ptr__;
}

Assistant:

static ZSTD_parameters ZSTD_getParams_internal(int compressionLevel, unsigned long long srcSizeHint, size_t dictSize, ZSTD_cParamMode_e mode) {
    ZSTD_parameters params;
    ZSTD_compressionParameters const cParams = ZSTD_getCParams_internal(compressionLevel, srcSizeHint, dictSize, mode);
    DEBUGLOG(5, "ZSTD_getParams (cLevel=%i)", compressionLevel);
    ZSTD_memset(&params, 0, sizeof(params));
    params.cParams = cParams;
    params.fParams.contentSizeFlag = 1;
    return params;
}